

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O3

TextureFormat vk::getStencilCopyFormat(VkFormat combinedFormat)

{
  TextureFormat TVar1;
  
  TVar1.order = CHANNELORDER_LAST;
  TVar1.type = CHANNELTYPE_LAST;
  if (combinedFormat - VK_FORMAT_S8_UINT < 4) {
    TVar1.order = S;
    TVar1.type = UNSIGNED_INT8;
  }
  return TVar1;
}

Assistant:

tcu::TextureFormat getStencilCopyFormat (VkFormat combinedFormat)
{
	switch (combinedFormat)
	{
		case VK_FORMAT_D16_UNORM_S8_UINT:
		case VK_FORMAT_D24_UNORM_S8_UINT:
		case VK_FORMAT_D32_SFLOAT_S8_UINT:
		case VK_FORMAT_S8_UINT:
			return mapVkFormat(VK_FORMAT_S8_UINT);

		case VK_FORMAT_D16_UNORM:
		case VK_FORMAT_X8_D24_UNORM_PACK32:
		case VK_FORMAT_D32_SFLOAT:
		default:
			DE_FATAL("Unexpected depth/stencil format");
			return tcu::TextureFormat();
	}
}